

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_full_gau(char *fn)

{
  int iVar1;
  uint local_48;
  uint local_44;
  uint32 m;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_density;
  uint32 *veclen;
  uint32 n_feat;
  uint32 n_mgau;
  vector_t ****var;
  char *fn_local;
  
  var = (vector_t ****)fn;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0xd0,"Reading %s\n",fn);
  iVar1 = s3gau_read_full((char *)var,(vector_t *****)&n_feat,(uint32 *)((long)&veclen + 4),
                          (uint32 *)&veclen,&j,(uint32 **)&i);
  if (iVar1 == 0) {
    printf("param %u %u %u (full)\n",(ulong)veclen._4_4_,(ulong)(uint)veclen,(ulong)j);
    for (k = 0; k < veclen._4_4_; k = k + 1) {
      printf("mgau %u\n",(ulong)k);
      for (l = 0; l < (uint)veclen; l = l + 1) {
        printf("feat %u\n",(ulong)l);
        for (m = 0; m < j; m = m + 1) {
          printf("density %4u (%ux%u)\n",(ulong)m,(ulong)_i[l],(ulong)_i[l]);
          for (local_44 = 0; local_44 < _i[l]; local_44 = local_44 + 1) {
            local_48 = 0;
            while( true ) {
              if (_i[l] <= local_48) break;
              printf(e_fmt,(double)_n_feat[k][l][m][local_44][local_48]);
              local_48 = local_48 + 1;
            }
            printf("\n");
          }
        }
      }
    }
    ckd_free(_i);
    fn_local._4_4_ = 0;
  }
  else {
    fn_local._4_4_ = -1;
  }
  return fn_local._4_4_;
}

Assistant:

int
print_full_gau(const char *fn)
{
    vector_t ****var;
    uint32 n_mgau;
    uint32 n_feat;
    uint32 *veclen;
    uint32 n_density;
    uint32 i, j, k, l, m;

    E_INFO("Reading %s\n",  fn);
    
    if (s3gau_read_full(fn,
			&var,
			&n_mgau,
			&n_feat,
			&n_density,
			&veclen) != S3_SUCCESS)
	return S3_ERROR;

    printf("param %u %u %u (full)\n", n_mgau, n_feat, n_density);

    for (i = 0; i < n_mgau; i++) {
	printf("mgau %u\n", i);
	for (j = 0; j < n_feat; j++) {
	    printf("feat %u\n", j);
	    for (k = 0; k < n_density; k++) {
		printf("density %4u (%ux%u)\n", k, veclen[j], veclen[j]);
		for (l = 0; l < veclen[j]; l++) {
		    for (m = 0; m < veclen[j]; m++) {
			printf(e_fmt, var[i][j][k][l][m]);
		    }
		printf("\n");
		}
	    }
	}
    }
    ckd_free(veclen);
    return S3_SUCCESS;
}